

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor-inl.h
# Opt level: O0

void __thiscall spdlog::details::executor::~executor(executor *this)

{
  long in_RDI;
  log_msg *in_stack_ffffffffffffffe8;
  logger *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x1a8) != 0) {
    *(long *)(*(long *)(in_RDI + 0x1a8) + 0x68) = *(long *)(in_RDI + 0x1a8) + 400;
    logger::executor_callback
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,SUB81((ulong)in_RDI >> 0x38,0),
               SUB81((ulong)in_RDI >> 0x30,0));
    context::~context((context *)0x15f9a1);
  }
  return;
}

Assistant:

SPDLOG_INLINE executor::~executor() noexcept(false)
{
    if (ctx_)
    {
        ctx_->msg.params = &ctx_->msg.params_buffer;
        try
        {
            ctx_->lgr->executor_callback(ctx_->msg, ctx_->log_enabled, ctx_->traceback_enabled);
        }
        catch (...)
        {
            ctx_->~context();
            throw;
        }
        ctx_->~context();
    }
}